

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O3

duckdb_state
duckdb_arrow_scan(duckdb_connection connection,char *table_name,duckdb_arrow_stream arrow)

{
  int iVar1;
  unsigned_long uVar2;
  Relation *name;
  idx_t i_1;
  long lVar3;
  duckdb_state dVar4;
  idx_t i;
  ulong uVar5;
  initializer_list<duckdb::Value> __l;
  vector<void_(*)(ArrowSchema_*),_std::allocator<void_(*)(ArrowSchema_*)>_> release_fns;
  ArrowSchema schema;
  allocator local_1ca;
  allocator_type local_1c9;
  undefined1 local_1c8 [40];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_1a0 [24];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 local_168 [24];
  undefined2 local_150;
  undefined1 local_14e;
  undefined1 local_148 [88];
  Value local_f0 [3];
  
  iVar1 = (**(code **)arrow)(arrow,local_148 + 0x10);
  dVar4 = DuckDBError;
  if (iVar1 != 1) {
    uVar2 = duckdb::NumericCastImpl<unsigned_long,_long,_false>::Convert(local_148._48_8_);
    std::vector<void_(*)(ArrowSchema_*),_std::allocator<void_(*)(ArrowSchema_*)>_>::vector
              ((vector<void_(*)(ArrowSchema_*),_std::allocator<void_(*)(ArrowSchema_*)>_> *)
               (local_1c8 + 0x10),uVar2,(allocator_type *)local_f0);
    uVar5 = 0;
    while( true ) {
      uVar2 = duckdb::NumericCastImpl<unsigned_long,_long,_false>::Convert(local_148._48_8_);
      if (uVar2 <= uVar5) break;
      lVar3 = *(long *)(local_148._56_8_ + uVar5 * 8);
      *(undefined8 *)(local_1c8._16_8_ + uVar5 * 8) = *(undefined8 *)(lVar3 + 0x38);
      *(code **)(lVar3 + 0x38) = arrow_array_stream_wrapper::anon_unknown_0::EmptySchemaRelease;
      uVar5 = uVar5 + 1;
    }
    local_168._16_8_ = (pointer)0x63735f776f727261;
    local_150 = 0x6e61;
    local_168._8_8_ = (pointer)0xa;
    local_14e = 0;
    local_168._0_8_ = (pointer)(local_168 + 0x10);
    duckdb::Value::POINTER(local_f0,(uintptr_t)arrow);
    duckdb::Value::POINTER(local_f0 + 1,0xc2db9b);
    duckdb::Value::POINTER(local_f0 + 2,0xc2dc27);
    __l._M_len = 3;
    __l._M_array = local_f0;
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(local_1a0,__l,&local_1c9);
    duckdb::Connection::TableFunction
              ((Connection *)local_1c8,(string *)connection,(vector<duckdb::Value,_true> *)local_168
              );
    name = duckdb::shared_ptr<duckdb::Relation,_true>::operator->
                     ((shared_ptr<duckdb::Relation,_true> *)local_1c8);
    std::__cxx11::string::string((string *)local_188,table_name,&local_1ca);
    duckdb::Relation::CreateView((Relation *)local_148,(string *)name,SUB81(local_188,0),true);
    if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
    }
    if (local_188[0] != local_178) {
      operator_delete(local_188[0]);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
    }
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_1a0);
    lVar3 = 0x80;
    do {
      duckdb::Value::~Value((Value *)(&local_f0[0].type_.id_ + lVar3));
      lVar3 = lVar3 + -0x40;
    } while (lVar3 != -0x40);
    if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_);
    }
    uVar5 = 0;
    while( true ) {
      uVar2 = duckdb::NumericCastImpl<unsigned_long,_long,_false>::Convert(local_148._48_8_);
      if (uVar2 <= uVar5) break;
      *(undefined8 *)(*(long *)(local_148._56_8_ + uVar5 * 8) + 0x38) =
           *(undefined8 *)(local_1c8._16_8_ + uVar5 * 8);
      uVar5 = uVar5 + 1;
    }
    dVar4 = DuckDBSuccess;
    if ((warning_callback_t)local_1c8._16_8_ != (warning_callback_t)0x0) {
      operator_delete((void *)local_1c8._16_8_);
      dVar4 = DuckDBSuccess;
    }
  }
  return dVar4;
}

Assistant:

duckdb_state duckdb_arrow_scan(duckdb_connection connection, const char *table_name, duckdb_arrow_stream arrow) {
	auto stream = reinterpret_cast<ArrowArrayStream *>(arrow);

	// Backup release functions - we nullify children schema release functions because we don't want to release on
	// behalf of the caller, downstream in our code. Note that Arrow releases target immediate children, but aren't
	// recursive. So we only back up immediate children here and restore their functions.
	ArrowSchema schema;
	if (stream->get_schema(stream, &schema) == DuckDBError) {
		return DuckDBError;
	}

	typedef void (*release_fn_t)(ArrowSchema *);
	std::vector<release_fn_t> release_fns(duckdb::NumericCast<idx_t>(schema.n_children));
	for (idx_t i = 0; i < duckdb::NumericCast<idx_t>(schema.n_children); i++) {
		auto child = schema.children[i];
		release_fns[i] = child->release;
		child->release = arrow_array_stream_wrapper::EmptySchemaRelease;
	}

	auto ret = arrow_array_stream_wrapper::Ingest(connection, table_name, stream);

	// Restore release functions.
	for (idx_t i = 0; i < duckdb::NumericCast<idx_t>(schema.n_children); i++) {
		schema.children[i]->release = release_fns[i];
	}

	return ret;
}